

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O2

int __thiscall VanEmdeBoasTree::remove(VanEmdeBoasTree *this,char *__filename)

{
  Node **ppNVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int in_EDX;
  VanEmdeBoasTree *this_00;
  Node *root;
  undefined7 uVar5;
  
  root = *(Node **)__filename;
  if ((((in_EDX < 0 || root == (Node *)0x0) || (iVar2 = root->uni, iVar2 <= in_EDX)) ||
      (in_EDX < root->min)) || (iVar3 = root->max, iVar3 < in_EDX)) {
LAB_001087a8:
    iVar2 = 0;
  }
  else {
    uVar5 = (undefined7)((ulong)this >> 8);
    this_00 = this;
    if (root->min == in_EDX) {
      if ((root->summary == (Node *)0x0) || (iVar2 = root->summary->min, iVar2 == -0x80000000)) {
        if (iVar3 == in_EDX) {
          root->min = -0x80000000;
          root->max = -0x80000000;
          Node::~Node(root);
          operator_delete(root,0x28);
          __filename[0] = '\0';
          __filename[1] = '\0';
          __filename[2] = '\0';
          __filename[3] = '\0';
          __filename[4] = '\0';
          __filename[5] = '\0';
          __filename[6] = '\0';
          __filename[7] = '\0';
        }
        else {
          root->min = iVar3;
        }
        return (int)CONCAT71(uVar5,1);
      }
      pcVar4 = index(this,(char *)root,iVar2);
      in_EDX = (int)pcVar4;
      root = *(Node **)__filename;
      root->min = in_EDX;
      iVar2 = root->uni;
    }
    if (2 < iVar2) {
      iVar2 = high(this_00,root,in_EDX);
      ppNVar1 = (*(Node **)__filename)->cluster;
      low(this_00,*(Node **)__filename,in_EDX);
      this_00 = this;
      iVar3 = remove(this,(char *)(ppNVar1 + iVar2));
      if ((char)iVar3 == '\0') goto LAB_001087a8;
      root = *(Node **)__filename;
      if (root->cluster[iVar2] == (Node *)0x0) {
        iVar2 = remove(this,(char *)&root->summary);
        if ((char)iVar2 == '\0') goto LAB_001087a8;
        root = *(Node **)__filename;
        this_00 = this;
      }
    }
    iVar2 = (int)CONCAT71(uVar5,1);
    if (root->max == in_EDX) {
      if ((root->summary == (Node *)0x0) || (iVar3 = root->summary->max, iVar3 == -0x80000000)) {
        root->max = root->min;
      }
      else {
        pcVar4 = index(this_00,(char *)root,iVar3);
        *(int *)(*(long *)__filename + 0x14) = (int)pcVar4;
      }
    }
  }
  return iVar2;
}

Assistant:

bool VanEmdeBoasTree::remove(Node *&root, int value) {
    if (!root) {
        return false;
    }

    if (value < 0 || value >= root->uni) {
        return false;
    }
    if (root->min > value || root->max < value) {
        return false;
    }

    if (root->min == value) {
        int i;
        if (!findMin(root->summary, i) || i == INT_MIN) {
            if (root->min != root->max) {
                root->min = root->max;
                return true;
            }

            root->min = root->max = INT_MIN;
            delete root;
            root = nullptr;
            return true;
        }
        value = root->min = index(root, i, root->cluster[i]->min);
    }

    if (root->uni > 2) {
        int highVal = high(root, value);
        if (!remove(root->cluster[highVal], low(root, value))) {
            return false;
        }

        int tmp;
        if (!findMin(root->cluster[highVal], tmp) || tmp == INT_MIN) {
            if (!remove(root->summary, highVal)) {
                return false;
            }
        }
    }

    if (root->max == value) {
        int tmp;
        if (!findMax(root->summary, tmp) || tmp == INT_MIN) {
            root->max = root->min;
        } else {
            int i;
            if (!findMax(root->summary, i)) {
                return false;
            }
            root->max = index(root, i, root->cluster[i]->max);
        }
    }
    return true;
}